

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

factor * __thiscall
merlin::factor::logsumexp(factor *__return_storage_ptr__,factor *this,variable_set *sum_out)

{
  undefined8 extraout_RAX;
  double __x;
  double __x_00;
  variable_set target;
  factor Scaled;
  variable_set local_110;
  factor local_d8;
  factor local_78;
  
  variable_set::operator-(&local_110,&this->v_,sum_out);
  maxmarginal(__return_storage_ptr__,this,&local_110);
  binaryOp<merlin::factor::binOpMinus>(&local_d8,this,__return_storage_ptr__);
  exp(&local_d8,__x);
  marginal(&local_78,&local_d8,&local_110);
  log(&local_78,__x_00);
  binaryOpIP<merlin::factor::binOpPlus>(__return_storage_ptr__,extraout_RAX);
  ~factor(&local_78);
  ~factor(&local_d8);
  variable_set::~variable_set(&local_110);
  return __return_storage_ptr__;
}

Assistant:

factor logsumexp(const variable_set& sum_out) const {
		variable_set target = v_ - sum_out;
		factor mx = maxmarginal(target);
		factor Scaled = *this - mx;
		Scaled.exp();
		mx += Scaled.marginal(target).log();
		return mx;
	}